

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test_core.c
# Opt level: O0

void OSSL_SELF_TEST_onbegin(OSSL_SELF_TEST *st,char *type,char *desc)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  OSSL_SELF_TEST *in_stack_000000b0;
  
  if ((in_RDI != (undefined8 *)0x0) && (in_RDI[3] != 0)) {
    *in_RDI = "Start";
    in_RDI[1] = in_RSI;
    in_RDI[2] = in_RDX;
    self_test_setparams(in_stack_000000b0);
    (*(code *)in_RDI[3])(in_RDI + 4,in_RDI[0x18]);
  }
  return;
}

Assistant:

void OSSL_SELF_TEST_onbegin(OSSL_SELF_TEST *st, const char *type,
                            const char *desc)
{
    if (st != NULL && st->cb != NULL) {
        st->phase = OSSL_SELF_TEST_PHASE_START;
        st->type = type;
        st->desc = desc;
        self_test_setparams(st);
        (void)st->cb(st->params, st->cb_arg);
    }
}